

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilePS.cpp
# Opt level: O3

void __thiscall
chrono::ChFile_ps::DrawGraphLabel
          (ChFile_ps *this,double dx,double dy,double fontsize,char *label,int dolinesample,
          bool background,double backwidth,ChFile_ps_color bkgndcolor)

{
  ChStreamOutAscii *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  double size;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ChStreamOutAscii *this_01;
  undefined7 in_register_00000009;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar10;
  undefined1 in_register_00001208 [56];
  undefined1 auVar9 [64];
  double dVar12;
  undefined1 in_register_00001248 [56];
  undefined1 auVar11 [64];
  undefined1 in_register_00001288 [56];
  undefined1 auVar13 [64];
  double local_e8;
  double local_d8;
  ChVector2<double> local_98;
  ChVector2<double> local_88;
  ChVector2<double> local_78;
  ChVector2<double> local_68;
  ChVector2<double> local_58;
  ChVector2<double> local_48;
  ChVector2<double> local_38;
  
  auVar13._8_56_ = in_register_00001288;
  auVar13._0_8_ = fontsize;
  auVar11._8_56_ = in_register_00001248;
  auVar11._0_8_ = dy;
  auVar9._8_56_ = in_register_00001208;
  auVar9._0_8_ = dx;
  auVar2 = vunpcklpd_avx(auVar9._0_16_,auVar11._0_16_);
  local_e8 = auVar2._0_8_ + (this->G_p).m_data[0];
  dVar12 = auVar2._8_8_ + (this->G_p).m_data[1];
  this_00 = &(this->super_ChStreamOutAsciiFile).super_ChStreamOutAscii;
  uVar3 = vcmpsd_avx512f(auVar13._0_16_,ZEXT816(0),0);
  bVar4 = (bool)((byte)uVar3 & 1);
  size = (double)((ulong)bVar4 * 0x3fd3333333333333 + (ulong)!bVar4 * (long)fontsize);
  dVar8 = local_e8 + 0.6;
  dVar10 = dVar12 + 0.0;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = size;
  auVar2._8_8_ = 0x8000000000000000;
  auVar2._0_8_ = 0x8000000000000000;
  auVar7 = vxorpd_avx512vl(auVar7,auVar2);
  ChStreamOutAscii::operator<<(this_00,"GS\n");
  local_78.m_data[0] = (this->G_p).m_data[0];
  local_78.m_data[1] = (this->G_p).m_data[1];
  local_88.m_data[0] = (this->Gs_p).m_data[0];
  local_88.m_data[1] = (this->Gs_p).m_data[1];
  ClipRectangle(this,&local_78,&local_88,PAGE);
  SetFont(this,"/Times-Italic",size);
  auVar5._8_8_ = dVar10;
  auVar5._0_8_ = dVar8;
  auVar2 = vpermilpd_avx(auVar5,1);
  if ((int)CONCAT71(in_register_00000009,background) != 0) {
    local_d8 = auVar7._0_8_;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_d8;
    auVar5 = vfmadd132sd_fma(ZEXT816(0x3fe6666666666666),auVar2,auVar1);
    ChStreamOutAscii::operator<<(this_00,"GS\n");
    SetRGB(this,bkgndcolor.r,bkgndcolor.g,bkgndcolor.b);
    auVar6._8_8_ = dVar12;
    auVar6._0_8_ = local_e8;
    local_38.m_data[0] = (double)vmovlpd_avx(auVar6);
    local_48.m_data[0] = backwidth;
    local_48.m_data[1] = size * 1.4;
    local_38.m_data[1] = auVar5._0_8_;
    DrawRectangle(this,&local_38,&local_48,PAGE,true);
    ChStreamOutAscii::operator<<(this_00,"GR\n");
  }
  if (dolinesample != 0) {
    local_98.m_data[1] = dVar10;
    local_98.m_data[0] = dVar8;
    local_58.m_data[0] = local_e8 + 0.08;
    local_58.m_data[1] = (double)vmovhps_avx((undefined1  [16])local_98.m_data);
    DrawLine(this,&local_58,&local_98,PAGE);
    local_e8 = dVar8 + 0.3;
  }
  auVar2 = vfmadd213sd_fma(auVar7,ZEXT816(0) << 0x40,auVar2);
  this_01 = ChStreamOutAscii::operator<<(this_00,0.0);
  ChStreamOutAscii::operator<<(this_01," SG\n");
  local_68.m_data[0] = local_e8;
  local_d8 = auVar2._0_8_;
  local_68.m_data[1] = local_d8;
  DrawText(this,&local_68,label,PAGE,LEFT);
  ChStreamOutAscii::operator<<(this_00,"GR\n");
  return;
}

Assistant:

void ChFile_ps::DrawGraphLabel(double dx,
                               double dy,
                               double fontsize,
                               char* label,
                               int dolinesample,
                               bool background,
                               double backwidth,
                               ChFile_ps_color bkgndcolor) {
    if (fontsize == 0)
        fontsize = 0.3;
    ChVector2<> mp1, mp2, mp3;
    mp3.y() = G_p.y() + dy;
    mp1.y() = mp3.y() + 0.0;
    mp2.y() = mp1.y();
    mp1.x() = G_p.x() + dx;
    mp2.x() = G_p.x() + dx + 0.6;
    ChVector2<> mpa, mpb;
    mpa = mp1;
    mpa.y() -= fontsize * 0.7;
    mpb.x() = backwidth;
    mpb.y() = fontsize * 1.4;

    GrSave();
    ClipToGraph();
    SetFont((char*)"/Times-Italic", fontsize);

    if (background) {
        GrSave();
        SetRGB(bkgndcolor);
        DrawRectangle(mpa, mpb, Space::PAGE, true);
        GrRestore();
    }
    if (dolinesample) {
        mp1.x() += 0.08;
        DrawLine(mp1, mp2, Space::PAGE);
        mp3.x() = mp2.x() + 0.3;
    } else {
        mp3.x() = mp1.x();
    }
    mp3.y() = mp1.y() - fontsize * 0.0;
    SetGray(0.0);
    DrawText(mp3, label, Space::PAGE);

    GrRestore();
}